

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::post_regrid(NavierStokesBase *this,int lbase,int param_2)

{
  return;
}

Assistant:

void
NavierStokesBase::post_regrid (int lbase,
                               int /*new_finest*/)
{
#ifdef AMREX_PARTICLES
    if (NSPC && level == lbase)
    {
        NSPC->Redistribute(lbase);
    }
#else
    amrex::ignore_unused(lbase);
#endif
}